

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::checkDPIMethods
          (Compilation *this,
          span<const_slang::ast::SubroutineSymbol_*const,_18446744073709551615UL> dpiImports)

{
  pointer ppSVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  int iVar6;
  undefined4 uVar7;
  Scope *this_00;
  SyntaxNode *pSVar8;
  Scope *scope;
  SyntaxNode *pSVar9;
  size_t sVar10;
  pointer ppFVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  byte bVar16;
  char *pcVar17;
  group_type_pointer pgVar18;
  value_type_pointer ppVar19;
  value_type_pointer ppVar20;
  group_type_pointer pgVar21;
  value_type_pointer ppVar22;
  bool bVar23;
  _Head_base<1UL,_const_slang::ast::Scope_*,_false> a;
  Diagnostic *pDVar24;
  Type *pTVar25;
  Type *pTVar26;
  SourceLocation SVar27;
  ulong uVar28;
  uint64_t uVar29;
  pointer ppVar30;
  uint uVar31;
  long lVar32;
  pointer ppSVar33;
  Info *pIVar34;
  ulong uVar35;
  Info *in_R9;
  Info *pos0;
  ulong uVar36;
  string_view *args;
  ulong uVar37;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> *__u;
  uchar uVar38;
  uchar uVar42;
  uchar uVar43;
  byte bVar44;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  LookupLocation location;
  Token TVar46;
  string_view sVar47;
  SourceRange SVar48;
  Token cid;
  Token name;
  Token name_00;
  try_emplace_args_t local_1d9;
  string_view local_1d8;
  string_view cId_1;
  flat_hash_map<std::string_view,_const_SubroutineSymbol_*> nameMap;
  SubroutineSymbol *sub;
  flat_hash_map<const_SubroutineSymbol_*,_const_DPIExportSyntax_*> previousExports;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_100;
  flat_hash_map<std::tuple<std::string_view,_const_Scope_*>,_const_DPIExportSyntax_*> exportsByScope
  ;
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  exports;
  
  ppSVar33 = dpiImports._M_ptr;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .arrays.groups_size_index = 0x3f;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .arrays.groups_size_mask = 1;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .size_ctrl.ml = 0;
  nameMap.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
  .size_ctrl.size = 0;
  if (dpiImports._M_extent._M_extent_value._M_extent_value != 0) {
    ppSVar1 = ppSVar33 + dpiImports._M_extent._M_extent_value._M_extent_value;
    do {
      sub = *ppSVar33;
      this_00 = (sub->super_Symbol).parentScope;
      pSVar8 = (sub->super_Symbol).originatingSyntax;
      scope = (Scope *)pSVar8[5].parent;
      pSVar9 = pSVar8[5].previewNode;
      TVar46 = slang::syntax::SyntaxNode::getLastToken(*(SyntaxNode **)(pSVar8[6].previewNode + 5));
      cid.info = TVar46._0_8_;
      cid._0_8_ = pSVar9;
      name.info = in_R9;
      name._0_8_ = TVar46.info;
      previousExports.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
      .arrays._0_16_ =
           checkDPIMethods::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)this_00,scope,cid,name);
      if (previousExports.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
          .arrays.groups_size_index != 0) {
        uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &nameMap,(basic_string_view<char,_std::char_traits<char>_> *)
                                     &previousExports);
        pos0 = (Info *)(uVar29 >>
                       ((byte)nameMap.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                              .arrays.groups_size_index & 0x3f));
        lVar32 = (uVar29 & 0xff) * 4;
        uVar38 = (&UNK_00461acc)[lVar32];
        uVar42 = (&UNK_00461acd)[lVar32];
        uVar43 = (&UNK_00461ace)[lVar32];
        bVar16 = (&UNK_00461acf)[lVar32];
        uVar36 = 0;
        pIVar34 = pos0;
        do {
          ppVar19 = nameMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    .arrays.elements_;
          pgVar18 = nameMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    .arrays.groups_;
          pgVar2 = nameMap.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                   .arrays.groups_ + (long)pIVar34;
          bVar44 = pgVar2->m[0xf].n;
          auVar39[0] = -(pgVar2->m[0].n == uVar38);
          auVar39[1] = -(pgVar2->m[1].n == uVar42);
          auVar39[2] = -(pgVar2->m[2].n == uVar43);
          auVar39[3] = -(pgVar2->m[3].n == bVar16);
          auVar39[4] = -(pgVar2->m[4].n == uVar38);
          auVar39[5] = -(pgVar2->m[5].n == uVar42);
          auVar39[6] = -(pgVar2->m[6].n == uVar43);
          auVar39[7] = -(pgVar2->m[7].n == bVar16);
          auVar39[8] = -(pgVar2->m[8].n == uVar38);
          auVar39[9] = -(pgVar2->m[9].n == uVar42);
          auVar39[10] = -(pgVar2->m[10].n == uVar43);
          auVar39[0xb] = -(pgVar2->m[0xb].n == bVar16);
          auVar39[0xc] = -(pgVar2->m[0xc].n == uVar38);
          auVar39[0xd] = -(pgVar2->m[0xd].n == uVar42);
          auVar39[0xe] = -(pgVar2->m[0xe].n == uVar43);
          auVar39[0xf] = -(bVar44 == bVar16);
          uVar31 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
          in_R9 = pos0;
          if (uVar31 != 0) {
            do {
              uVar13 = 0;
              if (uVar31 != 0) {
                for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              ppVar3 = ppVar19 + (long)pIVar34 * 0xf + (ulong)uVar13;
              bVar23 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                       operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)&nameMap,
                                  (basic_string_view<char,_std::char_traits<char>_> *)
                                  &previousExports,&ppVar3->first);
              if (bVar23) {
                bVar23 = checkSignaturesMatch(sub,ppVar3->second);
                if (!bVar23) {
                  pDVar24 = Scope::addDiag(this_00,(DiagCode)0x8000d,(sub->super_Symbol).location);
                  Diagnostic::operator<<
                            (pDVar24,(string_view)
                                     previousExports.table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                     .arrays._0_16_);
                  Diagnostic::addNote(pDVar24,(DiagCode)0xa0001,
                                      (ppVar3->second->super_Symbol).location);
                }
                goto LAB_001f2125;
              }
              uVar31 = uVar31 - 1 & uVar31;
            } while (uVar31 != 0);
            bVar44 = pgVar18[(long)pIVar34].m[0xf].n;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar44) == 0) break;
          lVar32 = uVar36 + 1;
          uVar36 = uVar36 + 1;
          pIVar34 = (Info *)((long)&pIVar34->rawTextPtr + lVar32 &
                            nameMap.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                            .arrays.groups_size_mask);
        } while (uVar36 <= nameMap.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                           .arrays.groups_size_mask);
        if (nameMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
            .size_ctrl.size <
            nameMap.table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
            .size_ctrl.ml) {
          in_R9 = (Info *)&exports;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                    ((locator *)&exportsByScope,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                      *)&nameMap,(arrays_type *)&nameMap,(size_t)pos0,uVar29,
                     (try_emplace_args_t *)in_R9,
                     (basic_string_view<char,_std::char_traits<char>_> *)&previousExports,&sub);
          nameMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
          .size_ctrl.size =
               nameMap.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
               .size_ctrl.size + 1;
        }
        else {
          in_R9 = (Info *)&sub;
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*&>
                    ((locator *)&exportsByScope,
                     (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                      *)&nameMap,uVar29,(try_emplace_args_t *)&exports,
                     (basic_string_view<char,_std::char_traits<char>_> *)&previousExports,
                     (SubroutineSymbol **)in_R9);
        }
      }
LAB_001f2125:
      ppSVar33 = ppSVar33 + 1;
    } while (ppSVar33 != ppSVar1);
  }
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_size_index = 0x3f;
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_size_mask = 1;
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .size_ctrl.ml = 0;
  exportsByScope.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .size_ctrl.size = 0;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_size_mask = 1;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_size_index = 0x3f;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .size_ctrl.ml = 0;
  previousExports.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
  .size_ctrl.size = 0;
  std::
  vector<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
  ::vector(&exports,&this->dpiExports);
  ppVar30 = exports.
            super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar30 ==
        exports.
        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (exports.
          super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(exports.
                        super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)exports.
                              super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)exports.
                              super__Vector_base<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>,_std::allocator<std::pair<const_slang::syntax::DPIExportSyntax_*,_const_slang::ast::Scope_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (previousExports.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
          .arrays.elements_ != (value_type_pointer)0x0) {
        operator_delete(previousExports.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        .arrays.elements_,
                        previousExports.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        .arrays.groups_size_mask * 0x100 + 0x100);
      }
      if (exportsByScope.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
          .arrays.elements_ != (value_type_pointer)0x0) {
        operator_delete(exportsByScope.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        .arrays.elements_,
                        exportsByScope.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        .arrays.groups_size_mask * 0x1f0 + 0x1f0 & 0xffffffffffffffe0);
      }
      if (nameMap.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
          .arrays.elements_ != (value_type_pointer)0x0) {
        operator_delete(nameMap.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                        .arrays.elements_,
                        ((nameMap.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                          .arrays.groups_size_mask * 0x178 + 0x186) / 3 & 0xfffffffffffffff8) * 3);
      }
      return;
    }
    local_1d8._M_len = (size_t)ppVar30->first;
    local_1d8._M_str = (char *)ppVar30->second;
    sVar47 = parsing::Token::valueText(&((DPIExportSyntax *)local_1d8._M_len)->specString);
    pcVar17 = local_1d8._M_str;
    if ((sVar47._M_len == 3) &&
       ((char)*(short *)((long)sVar47._M_str + 2) == 'I' && *(short *)sVar47._M_str == 0x5044)) {
      SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0x60));
      Scope::addDiag((Scope *)pcVar17,(DiagCode)0xea0006,SVar48);
    }
    sVar47 = parsing::Token::valueText((Token *)(local_1d8._M_len + 0xa0));
    pcVar17 = local_1d8._M_str;
    SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
    location._12_4_ = 0;
    location.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
    location.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
    a._M_head_impl =
         (Scope *)Lookup::unqualifiedAt
                            ((Scope *)pcVar17,sVar47,location,SVar48,
                             (bitmask<slang::ast::LookupFlags>)0x0);
    pcVar17 = local_1d8._M_str;
    if ((SubroutineSymbol *)a._M_head_impl != (SubroutineSymbol *)0x0) {
      if (((Symbol *)&(a._M_head_impl)->compilation)->kind == Subroutine) {
        iVar6 = *(int *)((long)&a._M_head_impl[3].nameMap + 4);
        if (iVar6 == 1) {
          if (((Token *)(local_1d8._M_len + 0x90))->kind != FunctionKeyword) goto LAB_001f25b2;
        }
        else if ((iVar6 != 0) || (((Token *)(local_1d8._M_len + 0x90))->kind != TaskKeyword)) {
LAB_001f25b2:
          if ((SubroutineSymbol *)(a._M_head_impl)->lastMember ==
              (SubroutineSymbol *)local_1d8._M_str) {
            if (((ulong)a._M_head_impl[3].firstMember & 0x8000000000) == 0) {
              pTVar25 = DeclaredType::getType((DeclaredType *)&a._M_head_impl[2].thisSym);
              bVar23 = Type::isValidForDPIReturn(pTVar25);
              if (!bVar23) {
                pTVar26 = pTVar25->canonical;
                if (pTVar26 == (Type *)0x0) {
                  Type::resolveCanonical(pTVar25);
                  pTVar26 = pTVar25->canonical;
                }
                if ((pTVar26->super_Symbol).kind != ErrorType) {
                  pDVar24 = Scope::addDiag((Scope *)local_1d8._M_str,(DiagCode)0x570006,
                                           *(SourceLocation *)&(a._M_head_impl)->firstMember);
                  ast::operator<<(pDVar24,pTVar25);
                  SVar27 = parsing::Token::location((Token *)(local_1d8._M_len + 0xa0));
                  Diagnostic::addNote(pDVar24,(DiagCode)0x50001,SVar27);
                  goto LAB_001f2ae2;
                }
              }
              if (*(int *)&a._M_head_impl[1].importData != 0) {
                Scope::elaborate((Scope *)&a._M_head_impl[1].thisSym);
              }
              sVar10 = ((__extent_storage<18446744073709551615UL> *)&a._M_head_impl[4].lastMember)->
                       _M_extent_value;
              if (sVar10 != 0) {
                ppFVar11 = ((ArgList *)&a._M_head_impl[4].firstMember)->_M_ptr;
                lVar32 = 0;
                do {
                  lVar12 = *(long *)((long)ppFVar11 + lVar32);
                  if (*(int *)(lVar12 + 0x158) == 3) {
                    Scope::addDiag((Scope *)local_1d8._M_str,(DiagCode)0x270006,
                                   *(SourceLocation *)(lVar12 + 0x18));
                  }
                  pTVar25 = DeclaredType::getType((DeclaredType *)(lVar12 + 0x40));
                  bVar23 = Type::isValidForDPIArg(pTVar25);
                  if (!bVar23) {
                    pTVar26 = pTVar25->canonical;
                    if (pTVar26 == (Type *)0x0) {
                      Type::resolveCanonical(pTVar25);
                      pTVar26 = pTVar25->canonical;
                    }
                    if ((pTVar26->super_Symbol).kind != ErrorType) {
                      pDVar24 = Scope::addDiag((Scope *)local_1d8._M_str,(DiagCode)0x560006,
                                               *(SourceLocation *)(lVar12 + 0x18));
                      ast::operator<<(pDVar24,pTVar25);
                      SVar27 = parsing::Token::location((Token *)(local_1d8._M_len + 0xa0));
                      Diagnostic::addNote(pDVar24,(DiagCode)0x50001,SVar27);
                    }
                  }
                  lVar32 = lVar32 + 8;
                } while (sVar10 << 3 != lVar32);
              }
              ppVar20 = previousExports.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                        .arrays.elements_;
              pcVar17 = local_1d8._M_str;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = a._M_head_impl;
              uVar35 = SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                       SUB168(auVar14 * ZEXT816(0x9e3779b97f4a7c15),0);
              uVar28 = uVar35 >> ((byte)previousExports.table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                        .arrays.groups_size_index & 0x3f);
              uVar7 = (&boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::
                        match_word(unsigned_long)::word)[uVar35 & 0xff];
              uVar37 = 0;
              uVar36 = uVar28;
              do {
                pgVar4 = previousExports.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                         .arrays.groups_ + uVar36;
                bVar16 = pgVar4->m[0xf].n;
                uVar38 = (uchar)uVar7;
                auVar45[0] = -(pgVar4->m[0].n == uVar38);
                uVar42 = (uchar)((uint)uVar7 >> 8);
                auVar45[1] = -(pgVar4->m[1].n == uVar42);
                uVar43 = (uchar)((uint)uVar7 >> 0x10);
                auVar45[2] = -(pgVar4->m[2].n == uVar43);
                bVar44 = (byte)((uint)uVar7 >> 0x18);
                auVar45[3] = -(pgVar4->m[3].n == bVar44);
                auVar45[4] = -(pgVar4->m[4].n == uVar38);
                auVar45[5] = -(pgVar4->m[5].n == uVar42);
                auVar45[6] = -(pgVar4->m[6].n == uVar43);
                auVar45[7] = -(pgVar4->m[7].n == bVar44);
                auVar45[8] = -(pgVar4->m[8].n == uVar38);
                auVar45[9] = -(pgVar4->m[9].n == uVar42);
                auVar45[10] = -(pgVar4->m[10].n == uVar43);
                auVar45[0xb] = -(pgVar4->m[0xb].n == bVar44);
                auVar45[0xc] = -(pgVar4->m[0xc].n == uVar38);
                auVar45[0xd] = -(pgVar4->m[0xd].n == uVar42);
                auVar45[0xe] = -(pgVar4->m[0xe].n == uVar43);
                auVar45[0xf] = -(bVar16 == bVar44);
                for (uVar31 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                                            (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
                    local_100.
                    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)a._M_head_impl,
                    uVar31 != 0; uVar31 = uVar31 - 1 & uVar31) {
                  iVar6 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                    }
                  }
                  if ((SubroutineSymbol *)a._M_head_impl ==
                      *(SubroutineSymbol **)
                       ((long)&previousExports.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                               .arrays.elements_[uVar36 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
                    SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
                    pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x4000d,SVar48);
                    pDVar24 = Diagnostic::operator<<
                                        (pDVar24,*(string_view *)&(a._M_head_impl)->thisSym);
                    SVar27 = parsing::Token::location
                                       ((Token *)(*(long *)((long)&ppVar20[uVar36 * 0xf].second +
                                                           (ulong)(uint)(iVar6 << 4)) + 0xa0));
                    Diagnostic::addNote(pDVar24,(DiagCode)0xa0001,SVar27);
                    goto LAB_001f2ae2;
                  }
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[(uint)uVar35 & 7] & bVar16) == 0)
                break;
                lVar32 = uVar36 + uVar37;
                uVar37 = uVar37 + 1;
                uVar36 = lVar32 + 1U &
                         previousExports.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                         .arrays.groups_size_mask;
              } while (uVar37 <= previousExports.table_.
                                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                 .arrays.groups_size_mask);
              if (previousExports.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                  .size_ctrl.size <
                  previousExports.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                  .size_ctrl.ml) {
                args = &cId_1;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                ::
                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                          ((locator *)&sub,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                            *)&previousExports,(arrays_type *)&previousExports,uVar28,uVar35,
                           (try_emplace_args_t *)args,(SubroutineSymbol **)&local_100,
                           (DPIExportSyntax **)&local_1d8);
                previousExports.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                .size_ctrl.size =
                     previousExports.table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::SubroutineSymbol_*,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<const_slang::ast::SubroutineSymbol_*>,_std::equal_to<const_slang::ast::SubroutineSymbol_*>,_std::allocator<std::pair<const_slang::ast::SubroutineSymbol_*const,_const_slang::syntax::DPIExportSyntax_*>_>_>
                     .size_ctrl.size + 1;
              }
              else {
                args = &local_1d8;
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                ::
                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*&>
                          ((locator *)&sub,
                           (table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::SubroutineSymbol_const*,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::SubroutineSymbol_const*,void>,std::equal_to<slang::ast::SubroutineSymbol_const*>,std::allocator<std::pair<slang::ast::SubroutineSymbol_const*const,slang::syntax::DPIExportSyntax_const*>>>
                            *)&previousExports,uVar35,(try_emplace_args_t *)&cId_1,
                           (SubroutineSymbol **)&local_100,(DPIExportSyntax **)args);
              }
              TVar46.info = *(Info **)(local_1d8._M_len + 0xa0);
              TVar46._0_8_ = ((Token *)(local_1d8._M_len + 0x70))->info;
              name_00.info = (Info *)args;
              name_00._0_8_ = ((Token *)(local_1d8._M_len + 0xa0))->info;
              cId_1 = checkDPIMethods::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)local_1d8._M_str,
                                 *(Scope **)(local_1d8._M_len + 0x70),TVar46,name_00);
              if (cId_1._M_len != 0) {
                local_100.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)a._M_head_impl;
                uVar29 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                         operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)&nameMap,&cId_1);
                uVar35 = uVar29 >> ((byte)nameMap.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                          .arrays.groups_size_index & 0x3f);
                lVar32 = (uVar29 & 0xff) * 4;
                uVar38 = (&UNK_00461acc)[lVar32];
                uVar42 = (&UNK_00461acd)[lVar32];
                uVar43 = (&UNK_00461ace)[lVar32];
                bVar16 = (&UNK_00461acf)[lVar32];
                uVar28 = 0;
                uVar36 = uVar35;
                do {
                  ppVar19 = nameMap.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                            .arrays.elements_;
                  pgVar18 = nameMap.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                            .arrays.groups_;
                  pgVar2 = nameMap.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                           .arrays.groups_ + uVar36;
                  bVar44 = pgVar2->m[0xf].n;
                  auVar40[0] = -(pgVar2->m[0].n == uVar38);
                  auVar40[1] = -(pgVar2->m[1].n == uVar42);
                  auVar40[2] = -(pgVar2->m[2].n == uVar43);
                  auVar40[3] = -(pgVar2->m[3].n == bVar16);
                  auVar40[4] = -(pgVar2->m[4].n == uVar38);
                  auVar40[5] = -(pgVar2->m[5].n == uVar42);
                  auVar40[6] = -(pgVar2->m[6].n == uVar43);
                  auVar40[7] = -(pgVar2->m[7].n == bVar16);
                  auVar40[8] = -(pgVar2->m[8].n == uVar38);
                  auVar40[9] = -(pgVar2->m[9].n == uVar42);
                  auVar40[10] = -(pgVar2->m[10].n == uVar43);
                  auVar40[0xb] = -(pgVar2->m[0xb].n == bVar16);
                  auVar40[0xc] = -(pgVar2->m[0xc].n == uVar38);
                  auVar40[0xd] = -(pgVar2->m[0xd].n == uVar42);
                  auVar40[0xe] = -(pgVar2->m[0xe].n == uVar43);
                  auVar40[0xf] = -(bVar44 == bVar16);
                  uVar31 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
                  if (uVar31 != 0) {
                    do {
                      uVar13 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                        }
                      }
                      ppVar3 = ppVar19 + uVar36 * 0xf + (ulong)uVar13;
                      bVar23 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                               ::operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                             *)&nameMap,&cId_1,&ppVar3->first);
                      if (bVar23) {
                        bVar23 = checkSignaturesMatch
                                           ((SubroutineSymbol *)a._M_head_impl,ppVar3->second);
                        pcVar17 = local_1d8._M_str;
                        if (!bVar23) {
                          SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
                          pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x8000d,SVar48);
                          Diagnostic::operator<<(pDVar24,cId_1);
                          Diagnostic::addNote(pDVar24,(DiagCode)0xa0001,
                                              (ppVar3->second->super_Symbol).location);
                        }
                        goto LAB_001f2b5f;
                      }
                      uVar31 = uVar31 - 1 & uVar31;
                    } while (uVar31 != 0);
                    bVar44 = pgVar18[uVar36].m[0xf].n;
                  }
                  if (((&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift)[(uint)uVar29 & 7] & bVar44) == 0)
                  break;
                  lVar32 = uVar36 + uVar28;
                  uVar28 = uVar28 + 1;
                  uVar36 = lVar32 + 1U &
                           nameMap.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                           .arrays.groups_size_mask;
                } while (uVar28 <= nameMap.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                                   .arrays.groups_size_mask);
                if (nameMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    .size_ctrl.size <
                    nameMap.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                              *)&nameMap,(arrays_type *)&nameMap,uVar35,uVar29,&local_1d9,&cId_1,
                             (SubroutineSymbol **)&local_100);
                  nameMap.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                  .size_ctrl.size =
                       nameMap.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ast::SubroutineSymbol_*>_>_>
                       .size_ctrl.size + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ast::SubroutineSymbol_const*>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::SubroutineSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::SubroutineSymbol_const*>>>
                              *)&nameMap,uVar29,&local_1d9,&cId_1,(SubroutineSymbol **)&local_100);
                }
LAB_001f2b5f:
                local_100.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
                     (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)local_1d8._M_str;
                local_100.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_len = cId_1._M_len;
                local_100.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                ._M_head_impl._M_str = cId_1._M_str;
                sub = (SubroutineSymbol *)0x0;
                slang::detail::hashing::
                HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
                ::apply((size_t *)&sub,&local_100);
                auVar15._8_8_ = 0;
                auVar15._0_8_ = sub;
                uVar37 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,8) ^
                         SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar15,0);
                uVar35 = uVar37 >> ((byte)exportsByScope.table_.
                                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                          .arrays.groups_size_index & 0x3f);
                lVar32 = (uVar37 & 0xff) * 4;
                uVar38 = (&UNK_00461acc)[lVar32];
                uVar42 = (&UNK_00461acd)[lVar32];
                uVar43 = (&UNK_00461ace)[lVar32];
                bVar16 = (&UNK_00461acf)[lVar32];
                uVar28 = 0;
                uVar36 = uVar35;
                do {
                  ppVar22 = exportsByScope.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            .arrays.elements_;
                  pgVar21 = exportsByScope.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                            .arrays.groups_;
                  pgVar5 = exportsByScope.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                           .arrays.groups_ + uVar36;
                  bVar44 = pgVar5->m[0xf].n;
                  auVar41[0] = -(pgVar5->m[0].n == uVar38);
                  auVar41[1] = -(pgVar5->m[1].n == uVar42);
                  auVar41[2] = -(pgVar5->m[2].n == uVar43);
                  auVar41[3] = -(pgVar5->m[3].n == bVar16);
                  auVar41[4] = -(pgVar5->m[4].n == uVar38);
                  auVar41[5] = -(pgVar5->m[5].n == uVar42);
                  auVar41[6] = -(pgVar5->m[6].n == uVar43);
                  auVar41[7] = -(pgVar5->m[7].n == bVar16);
                  auVar41[8] = -(pgVar5->m[8].n == uVar38);
                  auVar41[9] = -(pgVar5->m[9].n == uVar42);
                  auVar41[10] = -(pgVar5->m[10].n == uVar43);
                  auVar41[0xb] = -(pgVar5->m[0xb].n == bVar16);
                  auVar41[0xc] = -(pgVar5->m[0xc].n == uVar38);
                  auVar41[0xd] = -(pgVar5->m[0xd].n == uVar42);
                  auVar41[0xe] = -(pgVar5->m[0xe].n == uVar43);
                  auVar41[0xf] = -(bVar44 == bVar16);
                  uVar31 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
                  if (uVar31 != 0) {
                    do {
                      iVar6 = 0;
                      if (uVar31 != 0) {
                        for (; (uVar31 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                        }
                      }
                      __u = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                             *)((long)&ppVar22[uVar36 * 0xf].first.
                                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                       .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                       super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                       _M_head_impl + (ulong)(uint)(iVar6 << 5));
                      bVar23 = std::
                               __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                               ::__eq(&local_100,__u);
                      pcVar17 = local_1d8._M_str;
                      if (bVar23) {
                        SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
                        pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x5000d,SVar48);
                        Diagnostic::operator<<(pDVar24,cId_1);
                        SVar27 = parsing::Token::location
                                           ((Token *)&__u[1].
                                                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                                  .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>
                                                  .
                                                  super__Head_base<1UL,_const_slang::ast::Scope_*,_false>
                                                  ._M_head_impl[2].importData);
                        Diagnostic::addNote(pDVar24,(DiagCode)0xa0001,SVar27);
                        goto LAB_001f2ae2;
                      }
                      uVar31 = uVar31 - 1 & uVar31;
                    } while (uVar31 != 0);
                    bVar44 = pgVar21[uVar36].m[0xf].n;
                  }
                  if (((&boost::unordered::detail::foa::
                         group15<boost::unordered::detail::foa::plain_integral>::
                         is_not_overflowed(unsigned_long)::shift)[(uint)uVar37 & 7] & bVar44) == 0)
                  break;
                  lVar32 = uVar36 + uVar28;
                  uVar28 = uVar28 + 1;
                  uVar36 = lVar32 + 1U &
                           exportsByScope.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                           .arrays.groups_size_mask;
                } while (uVar28 <= exportsByScope.table_.
                                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                                   .arrays.groups_size_mask);
                if (exportsByScope.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                    .size_ctrl.size <
                    exportsByScope.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                              *)&exportsByScope,(arrays_type *)&exportsByScope,uVar35,uVar37,
                             &local_1d9,&local_100,(DPIExportSyntax **)&local_1d8);
                  exportsByScope.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                  .size_ctrl.size =
                       exportsByScope.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::DPIExportSyntax_*>_>_>
                       .size_ctrl.size + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*&>
                            ((locator *)&sub,
                             (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::DPIExportSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::DPIExportSyntax_const*>>>
                              *)&exportsByScope,uVar37,&local_1d9,&local_100,
                             (DPIExportSyntax **)&local_1d8);
                }
              }
            }
            else {
              SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
              pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x6000d,SVar48);
              Diagnostic::addNote(pDVar24,(DiagCode)0x50001,
                                  *(SourceLocation *)&(a._M_head_impl)->firstMember);
            }
          }
          else {
            SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
            pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x3000d,SVar48);
            Diagnostic::addNote(pDVar24,(DiagCode)0x50001,
                                *(SourceLocation *)&(a._M_head_impl)->firstMember);
          }
          goto LAB_001f2ae2;
        }
        SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0x90));
        pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x7000d,SVar48);
        Diagnostic::addNote(pDVar24,(DiagCode)0x50001,
                            *(SourceLocation *)&(a._M_head_impl)->firstMember);
      }
      else {
        SVar48 = parsing::Token::range((Token *)(local_1d8._M_len + 0xa0));
        pDVar24 = Scope::addDiag((Scope *)pcVar17,(DiagCode)0x23000a,SVar48);
        pDVar24 = Diagnostic::operator<<(pDVar24,sVar47);
        Diagnostic::addNote(pDVar24,(DiagCode)0x50001,
                            *(SourceLocation *)&(a._M_head_impl)->firstMember);
      }
    }
LAB_001f2ae2:
    ppVar30 = ppVar30 + 1;
  } while( true );
}

Assistant:

void Compilation::checkDPIMethods(std::span<const SubroutineSymbol* const> dpiImports) {
    auto getCId = [&](const Scope& scope, Token cid, Token name) {
        std::string_view text = cid ? cid.valueText() : name.valueText();
        if (!text.empty()) {
            auto tail = text.substr(1);
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]) ||
                std::ranges::any_of(tail, [](char c) { return !isValidCIdChar(c); })) {
                scope.addDiag(diag::InvalidDPICIdentifier, cid ? cid.range() : name.range())
                    << text;
                return std::string_view();
            }
        }
        return text;
    };

    flat_hash_map<std::string_view, const SubroutineSymbol*> nameMap;
    for (auto sub : dpiImports) {
        auto syntax = sub->getSyntax();
        SLANG_ASSERT(syntax);

        auto scope = sub->getParentScope();
        SLANG_ASSERT(scope);

        auto& dis = syntax->as<DPIImportSyntax>();
        std::string_view cId = getCId(*scope, dis.c_identifier, dis.method->name->getLastToken());
        if (cId.empty())
            continue;

        auto [it, inserted] = nameMap.emplace(cId, sub);
        if (!inserted) {
            if (!checkSignaturesMatch(*sub, *it->second)) {
                auto& diag = scope->addDiag(diag::DPISignatureMismatch, sub->location);
                diag << cId;
                diag.addNote(diag::NotePreviousDefinition, it->second->location);
            }
        }
    }

    flat_hash_map<std::tuple<std::string_view, const Scope*>, const DPIExportSyntax*>
        exportsByScope;
    flat_hash_map<const SubroutineSymbol*, const DPIExportSyntax*> previousExports;
    auto exports = dpiExports;
    for (auto [syntax, scope] : exports) {
        if (syntax->specString.valueText() == "DPI")
            scope->addDiag(diag::DPISpecDisallowed, syntax->specString.range());

        auto name = syntax->name.valueText();
        auto symbol = Lookup::unqualifiedAt(*scope, name, LookupLocation::max,
                                            syntax->name.range());
        if (!symbol)
            continue;

        if (symbol->kind != SymbolKind::Subroutine) {
            auto& diag = scope->addDiag(diag::NotASubroutine, syntax->name.range()) << name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        // This check is a little verbose because we're avoiding issuing an error if the
        // functionOrTask keyword is invalid, i.e. not 'function' or 'task'.
        auto& sub = symbol->as<SubroutineSymbol>();
        if ((sub.subroutineKind == SubroutineKind::Function &&
             syntax->functionOrTask.kind == TokenKind::TaskKeyword) ||
            (sub.subroutineKind == SubroutineKind::Task &&
             syntax->functionOrTask.kind == TokenKind::FunctionKeyword)) {
            auto& diag = scope->addDiag(diag::DPIExportKindMismatch,
                                        syntax->functionOrTask.range());
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            continue;
        }

        if (sub.getParentScope() != scope) {
            auto& diag = scope->addDiag(diag::DPIExportDifferentScope, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        if (sub.flags.has(MethodFlags::DPIImport)) {
            auto& diag = scope->addDiag(diag::DPIExportImportedFunc, syntax->name.range());
            diag.addNote(diag::NoteDeclarationHere, sub.location);
            continue;
        }

        auto& retType = sub.getReturnType();
        if (!retType.isValidForDPIReturn() && !retType.isError()) {
            auto& diag = scope->addDiag(diag::InvalidDPIReturnType, sub.location);
            diag << retType;
            diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
            continue;
        }

        for (auto arg : sub.getArguments()) {
            if (arg->direction == ArgumentDirection::Ref)
                scope->addDiag(diag::DPIRefArg, arg->location);

            auto& type = arg->getType();
            if (!type.isValidForDPIArg() && !type.isError()) {
                auto& diag = scope->addDiag(diag::InvalidDPIArgType, arg->location);
                diag << type;
                diag.addNote(diag::NoteDeclarationHere, syntax->name.location());
                continue;
            }
        }

        {
            auto [it, inserted] = previousExports.emplace(&sub, syntax);
            if (!inserted) {
                auto& diag = scope->addDiag(diag::DPIExportDuplicate, syntax->name.range())
                             << sub.name;
                diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                continue;
            }
        }

        std::string_view cId = getCId(*scope, syntax->c_identifier, syntax->name);
        if (!cId.empty()) {
            {
                auto [it, inserted] = nameMap.emplace(cId, &sub);
                if (!inserted) {
                    if (!checkSignaturesMatch(sub, *it->second)) {
                        auto& diag = scope->addDiag(diag::DPISignatureMismatch,
                                                    syntax->name.range());
                        diag << cId;
                        diag.addNote(diag::NotePreviousDefinition, it->second->location);
                    }
                }
            }
            {
                auto [it, inserted] = exportsByScope.emplace(std::make_tuple(cId, scope), syntax);
                if (!inserted) {
                    auto& diag = scope->addDiag(diag::DPIExportDuplicateCId, syntax->name.range());
                    diag << cId;
                    diag.addNote(diag::NotePreviousDefinition, it->second->name.location());
                }
            }
        }
    }
}